

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall Scene::Scene(Scene *this,int materials_size,int textures_size,int objects_size)

{
  Material **ppMVar1;
  Texture **ppTVar2;
  Object **ppOVar3;
  ulong uVar4;
  
  this->m_materials_size = materials_size;
  this->m_textures_size = textures_size;
  this->m_objects_size = objects_size;
  uVar4 = (ulong)(uint)materials_size * 8;
  if (materials_size < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppMVar1 = (Material **)operator_new__(uVar4);
  this->m_materials = ppMVar1;
  if (0 < materials_size) {
    uVar4 = 0;
    do {
      this->m_materials[uVar4] = (Material *)0x0;
      uVar4 = uVar4 + 1;
    } while ((uint)materials_size != uVar4);
  }
  uVar4 = (ulong)(uint)textures_size * 8;
  if (textures_size < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppTVar2 = (Texture **)operator_new__(uVar4);
  this->m_textures = ppTVar2;
  if (0 < textures_size) {
    uVar4 = 0;
    do {
      this->m_textures[uVar4] = (Texture *)0x0;
      uVar4 = uVar4 + 1;
    } while ((uint)textures_size != uVar4);
  }
  uVar4 = 0xffffffffffffffff;
  if (-1 < objects_size) {
    uVar4 = (ulong)(uint)objects_size * 8;
  }
  ppOVar3 = (Object **)operator_new__(uVar4);
  this->m_objects = ppOVar3;
  if (0 < objects_size) {
    uVar4 = 0;
    do {
      this->m_objects[uVar4] = (Object *)0x0;
      uVar4 = uVar4 + 1;
    } while ((uint)objects_size != uVar4);
  }
  return;
}

Assistant:

Scene::Scene(int materials_size, int textures_size, int objects_size)
: m_materials_size(materials_size), m_textures_size(textures_size) , m_objects_size(objects_size)
{
    m_materials = new Material *[m_materials_size];
    for(int i=0; i<m_materials_size; ++i) {
        m_materials[i] = nullptr;
    }

    m_textures = new Texture *[m_textures_size];
    for(int i=0; i<m_textures_size; ++i) {
        m_textures[i] = nullptr;
    }

    m_objects = new Object *[m_objects_size];
    for(int i=0; i<m_objects_size; ++i) {
        m_objects[i] = nullptr;
    }
}